

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_lrzip.c
# Opt level: O3

void test_write_filter_lrzip(void)

{
  wchar_t wVar1;
  int iVar2;
  void *pvVar3;
  archive *paVar4;
  char *pcVar5;
  archive_entry *entry;
  ssize_t sVar6;
  int64_t v2;
  uint uVar7;
  ulong uVar8;
  archive_entry *ae;
  size_t used1;
  char path [16];
  size_t used2;
  archive_entry *local_68;
  void *local_60;
  void *local_58;
  size_t local_50;
  char local_48 [16];
  size_t local_38;
  
  wVar1 = canLrzip();
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                   ,L',');
    test_skipping("lrzip command-line program not found");
    return;
  }
  pvVar3 = malloc(2000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                   ,L'1',(uint)(pvVar3 != (void *)0x0),"NULL != (buff = (char *)malloc(buffsize))",
                   (void *)0x0);
  local_58 = calloc(1,10000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                   ,L'4',(uint)(local_58 != (void *)0x0),"NULL != (data = (char *)malloc(datasize))"
                   ,(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                   ,L':',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_write_set_format_gnutar(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L';',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_gnutar(a)",paVar4);
  iVar2 = archive_write_add_filter_lrzip(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'<',-0x14,"ARCHIVE_WARN",(long)iVar2,"archive_write_add_filter_lrzip(a)",
                      paVar4);
  iVar2 = archive_write_set_bytes_per_block(paVar4,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'>',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_bytes_per_block(a, 10)",
                      paVar4);
  iVar2 = archive_filter_code(paVar4,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'?',10,"ARCHIVE_FILTER_LRZIP",(long)iVar2,"archive_filter_code(a, 0)",
                      (void *)0x0);
  pcVar5 = archive_filter_name(paVar4,0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
             ,L'@',"lrzip","\"lrzip\"",pcVar5,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
  local_60 = pvVar3;
  iVar2 = archive_write_open_memory(paVar4,pvVar3,2000000,&local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'B',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_open_memory(a, buff, buffsize, &used1)",paVar4);
  entry = archive_entry_new();
  local_68 = entry;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                   ,L'C',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_set_filetype(entry,0x8000);
  archive_entry_set_size(entry,10000);
  uVar8 = 0;
  do {
    sprintf(local_48,"file%03d",uVar8);
    archive_entry_copy_pathname(entry,local_48);
    iVar2 = archive_write_header(paVar4,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'I',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4);
    sVar6 = archive_write_data(paVar4,local_58,10000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                     ,L'K',(uint)(sVar6 == 10000),
                     "datasize == (size_t)archive_write_data(a, data, datasize)",paVar4);
    uVar7 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar7;
  } while (uVar7 != 100);
  archive_entry_free(entry);
  iVar2 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'N',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
  iVar2 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'O',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                   ,L'Q',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'R',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",paVar4);
  iVar2 = archive_read_support_filter_lrzip(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'S',-0x14,"ARCHIVE_WARN",(long)iVar2,"archive_read_support_filter_lrzip(a)",
                      paVar4);
  iVar2 = archive_read_open_memory(paVar4,local_60,local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'U',0,"ARCHIVE_OK",(long)iVar2,"archive_read_open_memory(a, buff, used1)",
                      paVar4);
  uVar8 = 0;
  do {
    sprintf(local_48,"file%03d",uVar8);
    iVar2 = archive_read_next_header(paVar4,&local_68);
    wVar1 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                                ,L'Y',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",
                                (void *)0x0);
    if (wVar1 == L'\0') break;
    pcVar5 = archive_entry_pathname(local_68);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
               ,L'[',local_48,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    v2 = archive_entry_size(local_68);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'\\',10000,"(int)datasize",v2,"archive_entry_size(ae)",(void *)0x0);
    uVar7 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar7;
  } while (uVar7 != 100);
  iVar2 = archive_filter_code(paVar4,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'^',10,"ARCHIVE_FILTER_LRZIP",(long)iVar2,"archive_filter_code(a, 0)",
                      (void *)0x0);
  pcVar5 = archive_filter_name(paVar4,0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
             ,L'_',"lrzip","\"lrzip\"",pcVar5,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
  iVar2 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'`',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar4);
  iVar2 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'a',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                   ,L'g',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_write_add_filter_lrzip(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'h',-0x14,"ARCHIVE_WARN",(long)iVar2,"archive_write_add_filter_lrzip(a)",
                      paVar4);
  iVar2 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'i',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                   ,L'k',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_write_add_filter_lrzip(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'l',-0x14,"ARCHIVE_WARN",(long)iVar2,"archive_write_add_filter_lrzip(a)",
                      paVar4);
  iVar2 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'm',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",(void *)0x0);
  iVar2 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'n',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                   ,L'p',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_write_set_format_ustar(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'q',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",paVar4);
  iVar2 = archive_write_add_filter_lrzip(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'r',-0x14,"ARCHIVE_WARN",(long)iVar2,"archive_write_add_filter_lrzip(a)",
                      paVar4);
  iVar2 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L's',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",(void *)0x0);
  iVar2 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L't',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                   ,L'v',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_write_set_format_ustar(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'w',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",paVar4);
  iVar2 = archive_write_add_filter_lrzip(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'x',-0x14,"ARCHIVE_WARN",(long)iVar2,"archive_write_add_filter_lrzip(a)",
                      paVar4);
  pvVar3 = local_60;
  iVar2 = archive_write_open_memory(paVar4,local_60,2000000,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'z',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
  iVar2 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'{',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",(void *)0x0);
  iVar2 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                      ,L'|',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  free(local_58);
  free(pvVar3);
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_lrzip)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used1, used2;
	int i;

	if (!canLrzip()) {
		skipping("lrzip command-line program not found");
		return;
	}

	buffsize = 2000000;
	assert(NULL != (buff = (char *)malloc(buffsize)));

	datasize = 10000;
	assert(NULL != (data = (char *)malloc(datasize)));
	memset(data, 0, datasize);

	/*
	 * Write 100 files and read them all back.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_gnutar(a));
	assertEqualIntA(a, ARCHIVE_WARN, archive_write_add_filter_lrzip(a));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_write_set_bytes_per_block(a, 10));
	assertEqualInt(ARCHIVE_FILTER_LRZIP, archive_filter_code(a, 0));
	assertEqualString("lrzip", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_write_open_memory(a, buff, buffsize, &used1));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_WARN, archive_read_support_filter_lrzip(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, buff, used1));
	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		if (!assertEqualInt(ARCHIVE_OK,
			archive_read_next_header(a, &ae)))
			break;
		assertEqualString(path, archive_entry_pathname(ae));
		assertEqualInt((int)datasize, archive_entry_size(ae));
	}
	assertEqualInt(ARCHIVE_FILTER_LRZIP, archive_filter_code(a, 0));
	assertEqualString("lrzip", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_WARN, archive_write_add_filter_lrzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_WARN, archive_write_add_filter_lrzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_WARN, archive_write_add_filter_lrzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_WARN, archive_write_add_filter_lrzip(a));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}